

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_avx2.c
# Opt level: O1

double aom_compute_correlation_avx2
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  int iVar6;
  undefined1 auVar7 [64];
  
  pauVar4 = (undefined1 (*) [16])(frame1 + (x1 + (y1 + -7) * stride1 + -7));
  pauVar5 = (undefined1 (*) [16])(frame2 + (x2 + (y2 + -7) * stride2 + -7));
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 0x10;
  do {
    auVar2 = vpmovzxbw_avx2(*pauVar4);
    auVar3 = vpmovzxbw_avx2(*pauVar5);
    auVar2 = vpmaddwd_avx2(auVar2,auVar3);
    auVar2 = vpaddd_avx2(auVar2,auVar7._0_32_);
    auVar7 = ZEXT3264(auVar2);
    pauVar4 = (undefined1 (*) [16])(*pauVar4 + stride1);
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + stride2);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  auVar1 = vphaddd_avx(auVar2._16_16_,auVar2._0_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  auVar1 = vcvtdq2pd_avx(auVar1);
  return one_over_stddev1 * one_over_stddev2 * (auVar1._0_8_ - mean1 * mean2);
}

Assistant:

double aom_compute_correlation_avx2(const unsigned char *frame1, int stride1,
                                    int x1, int y1, double mean1,
                                    double one_over_stddev1,
                                    const unsigned char *frame2, int stride2,
                                    int x2, int y2, double mean2,
                                    double one_over_stddev2) {
  __m256i cross_vec = _mm256_setzero_si256();

  frame1 += (y1 - MATCH_SZ_BY2) * stride1 + (x1 - MATCH_SZ_BY2);
  frame2 += (y2 - MATCH_SZ_BY2) * stride2 + (x2 - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m256i v1 = _mm256_cvtepu8_epi16(_mm_loadu_si128((__m128i *)frame1));
    const __m256i v2 = _mm256_cvtepu8_epi16(_mm_loadu_si128((__m128i *)frame2));

    cross_vec = _mm256_add_epi32(cross_vec, _mm256_madd_epi16(v1, v2));

    frame1 += stride1;
    frame2 += stride2;
  }

  // Sum cross_vec into a single value
  const __m128i tmp = _mm_add_epi32(_mm256_extracti128_si256(cross_vec, 0),
                                    _mm256_extracti128_si256(cross_vec, 1));
  const int cross = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1) +
                    _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  const double covariance = cross - mean1 * mean2;
  const double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}